

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_3> __thiscall
tcu::select<float,3>
          (tcu *this,Vector<float,_3> *trueVal,Vector<float,_3> *falseVal,Vector<bool,_3> *cond)

{
  bool *pbVar1;
  float *pfVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  float in_XMM1_Da;
  Vector<float,_3> VVar4;
  undefined4 local_44;
  undefined4 local_2c;
  int i;
  Vector<bool,_3> *cond_local;
  Vector<float,_3> *falseVal_local;
  Vector<float,_3> *trueVal_local;
  Vector<float,_3> *res;
  
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    pbVar1 = Vector<bool,_3>::operator[](cond,local_2c);
    if ((*pbVar1 & 1U) == 0) {
      pfVar2 = Vector<float,_3>::operator[](falseVal,local_2c);
      local_44 = *pfVar2;
    }
    else {
      pfVar2 = Vector<float,_3>::operator[](trueVal,local_2c);
      local_44 = *pfVar2;
    }
    pfVar2 = Vector<float,_3>::operator[]((Vector<float,_3> *)this,local_2c);
    uVar3 = (ulong)(uint)local_44;
    *pfVar2 = local_44;
  }
  VVar4.m_data[2] = in_XMM1_Da;
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_3>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}